

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

size_t bpkiCSRDec(bpki_csr_info_t *ci,octet *csr,size_t count)

{
  octet **ppoVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  octet *der;
  octet *der_00;
  octet *der_01;
  der_anchor_t *anchor;
  long in_RSI;
  long *in_RDI;
  size_t t_18;
  size_t t_17;
  size_t t_16;
  size_t t_15;
  size_t t_14;
  size_t t_13;
  size_t t_12;
  size_t t_11;
  size_t t_10;
  size_t t_9;
  size_t t_8;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  octet *ptr;
  der_anchor_t AlgId [1];
  der_anchor_t SPKI [1];
  der_anchor_t CertReqInfo [1];
  der_anchor_t CertReq [1];
  size_t in_stack_fffffffffffffeb8;
  u32 uVar13;
  size_t in_stack_fffffffffffffec0;
  octet *in_stack_fffffffffffffec8;
  der_anchor_t *in_stack_fffffffffffffed0;
  der_anchor_t *in_stack_fffffffffffffed8;
  octet *in_stack_fffffffffffffee0;
  octet *in_stack_fffffffffffffee8;
  octet *local_8;
  
  sVar2 = derTSEQDecStart(in_stack_fffffffffffffed8,(octet *)in_stack_fffffffffffffed0,
                          (size_t)in_stack_fffffffffffffec8,(u32)(in_stack_fffffffffffffec0 >> 0x20)
                         );
  if (sVar2 == 0xffffffffffffffff) {
    local_8 = (octet *)0xffffffffffffffff;
  }
  else {
    *in_RDI = (sVar2 + in_RSI) - in_RSI;
    sVar3 = derTSEQDecStart(in_stack_fffffffffffffed8,(octet *)in_stack_fffffffffffffed0,
                            (size_t)in_stack_fffffffffffffec8,
                            (u32)(in_stack_fffffffffffffec0 >> 0x20));
    if (sVar3 == 0xffffffffffffffff) {
      local_8 = (octet *)0xffffffffffffffff;
    }
    else {
      sVar4 = derTSIZEDec2((octet *)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                           (u32)(in_stack_fffffffffffffec0 >> 0x20),in_stack_fffffffffffffeb8);
      uVar13 = (u32)(in_stack_fffffffffffffeb8 >> 0x20);
      if (sVar4 == 0xffffffffffffffff) {
        local_8 = (octet *)0xffffffffffffffff;
      }
      else {
        sVar5 = derDec2(&in_stack_fffffffffffffed8->der,(size_t *)in_stack_fffffffffffffed0,
                        in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,uVar13);
        if (sVar5 == 0xffffffffffffffff) {
          local_8 = (octet *)0xffffffffffffffff;
        }
        else {
          sVar6 = derTSEQDecStart(in_stack_fffffffffffffed8,(octet *)in_stack_fffffffffffffed0,
                                  (size_t)in_stack_fffffffffffffec8,
                                  (u32)(in_stack_fffffffffffffec0 >> 0x20));
          if (sVar6 == 0xffffffffffffffff) {
            local_8 = (octet *)0xffffffffffffffff;
          }
          else {
            sVar7 = derTSEQDecStart(in_stack_fffffffffffffed8,(octet *)in_stack_fffffffffffffed0,
                                    (size_t)in_stack_fffffffffffffec8,
                                    (u32)(in_stack_fffffffffffffec0 >> 0x20));
            if (sVar7 == 0xffffffffffffffff) {
              local_8 = (octet *)0xffffffffffffffff;
            }
            else {
              sVar8 = derOIDDec2(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0,
                                 (char *)in_stack_fffffffffffffed8);
              if (sVar8 == 0xffffffffffffffff) {
                local_8 = (octet *)0xffffffffffffffff;
              }
              else {
                sVar9 = derOIDDec2(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0,
                                   (char *)in_stack_fffffffffffffed8);
                if (sVar9 == 0xffffffffffffffff) {
                  local_8 = (octet *)0xffffffffffffffff;
                }
                else {
                  sVar10 = derTSEQDecStop((octet *)in_stack_fffffffffffffed8,
                                          in_stack_fffffffffffffed0);
                  if (sVar10 == 0xffffffffffffffff) {
                    local_8 = (octet *)0xffffffffffffffff;
                  }
                  else {
                    sVar11 = derTBITDec2(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                         (size_t)in_stack_fffffffffffffed8,
                                         (u32)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                                         (size_t)in_stack_fffffffffffffec8);
                    if (sVar11 == 0xffffffffffffffff) {
                      local_8 = (octet *)0xffffffffffffffff;
                    }
                    else {
                      lVar12 = sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + 
                                                  sVar3 + sVar2 + in_RSI;
                      in_RDI[2] = (lVar12 - in_RSI) + -0x40;
                      sVar2 = derTSEQDecStop((octet *)in_stack_fffffffffffffed8,
                                             in_stack_fffffffffffffed0);
                      if (sVar2 == 0xffffffffffffffff) {
                        local_8 = (octet *)0xffffffffffffffff;
                      }
                      else {
                        sVar3 = derDec2(&in_stack_fffffffffffffed8->der,
                                        (size_t *)in_stack_fffffffffffffed0,
                                        in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,uVar13);
                        uVar13 = (u32)(in_stack_fffffffffffffec0 >> 0x20);
                        if (sVar3 == 0xffffffffffffffff) {
                          local_8 = (octet *)0xffffffffffffffff;
                        }
                        else {
                          der = (octet *)derTSEQDecStop((octet *)in_stack_fffffffffffffed8,
                                                        in_stack_fffffffffffffed0);
                          if (der == (octet *)0xffffffffffffffff) {
                            local_8 = (octet *)0xffffffffffffffff;
                          }
                          else {
                            local_8 = der + sVar3 + sVar2 + lVar12;
                            in_RDI[1] = (long)(local_8 + (-*in_RDI - in_RSI));
                            der_00 = (octet *)derTSEQDecStart(in_stack_fffffffffffffed8,
                                                              (octet *)in_stack_fffffffffffffed0,
                                                              (size_t)in_stack_fffffffffffffec8,
                                                              uVar13);
                            if (der_00 == (octet *)0xffffffffffffffff) {
                              local_8 = (octet *)0xffffffffffffffff;
                            }
                            else {
                              local_8 = der_00 + (long)local_8;
                              der_01 = (octet *)derOIDDec2(der,(size_t)der_00,
                                                           (char *)in_stack_fffffffffffffed8);
                              if (der_01 == (octet *)0xffffffffffffffff) {
                                local_8 = (octet *)0xffffffffffffffff;
                              }
                              else {
                                local_8 = der_01 + (long)local_8;
                                anchor = (der_anchor_t *)
                                         derDec4(der,(size_t)der_00,(u32)((ulong)der_01 >> 0x20),
                                                 in_stack_fffffffffffffed0,
                                                 (size_t)in_stack_fffffffffffffec8);
                                if (anchor == (der_anchor_t *)0xffffffffffffffff) {
                                  local_8 = (octet *)0xffffffffffffffff;
                                }
                                else {
                                  ppoVar1 = &anchor->der;
                                  sVar2 = derTSEQDecStop(der_01,anchor);
                                  if (sVar2 == 0xffffffffffffffff) {
                                    local_8 = (octet *)0xffffffffffffffff;
                                  }
                                  else {
                                    sVar3 = derTBITDec2(der,der_00,(size_t)der_01,
                                                        (u32)((ulong)anchor >> 0x20),sVar2);
                                    if (sVar3 == 0xffffffffffffffff) {
                                      local_8 = (octet *)0xffffffffffffffff;
                                    }
                                    else {
                                      in_RDI[3] = (long)(local_8 +
                                                        (long)ppoVar1 +
                                                        ((sVar3 + sVar2) - in_RSI) + -0x30);
                                      sVar4 = derTSEQDecStop(der_01,anchor);
                                      if (sVar4 == 0xffffffffffffffff) {
                                        local_8 = (octet *)0xffffffffffffffff;
                                      }
                                      else {
                                        local_8 = local_8 + (long)ppoVar1 +
                                                            ((sVar4 + sVar3 + sVar2) - in_RSI);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t bpkiCSRDec(bpki_csr_info_t* ci, const octet csr[], size_t count)
{
	der_anchor_t CertReq[1];
	der_anchor_t CertReqInfo[1];
	der_anchor_t SPKI[1];
	der_anchor_t AlgId[1];
	const octet* ptr = csr;
	// pre
	ASSERT(memIsValid(ci, sizeof(bpki_csr_info_t)));
	ASSERT(memIsValid(csr, count));
	// декодировать
	derDecStep(derSEQDecStart(CertReq, ptr, count), ptr, count);
	 ci->body_offset = ptr - csr;
	 derDecStep(derSEQDecStart(CertReqInfo, ptr, count), ptr, count);
	  derDecStep(derSIZEDec2(ptr, count, 0), ptr, count);
	  derDecStep(derDec2(0, 0, ptr, count, 0x30), ptr, count);
	  derDecStep(derSEQDecStart(SPKI, ptr, count), ptr, count);
	   derDecStep(derSEQDecStart(AlgId, ptr, count), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_bign_pubkey), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_bign_curve256v1), ptr, count);
	   derDecStep(derSEQDecStop(ptr, AlgId), ptr, count);
	   derDecStep(derBITDec2(0, ptr, count, 512), ptr, count);
	   ci->pubkey_offset = ptr - csr - 64;
	  derDecStep(derSEQDecStop(ptr, SPKI), ptr, count);
	  derDecStep(derDec2(0, 0, ptr, count, 0xA0), ptr, count);
	 derDecStep(derSEQDecStop(ptr, CertReqInfo), ptr, count);
	 ci->body_len = ptr - csr - ci->body_offset;
	 derDecStep(derSEQDecStart(AlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_bign_with_hbelt), ptr, count);
	  derDecStep(derNULLDec(ptr, count), ptr, count);
     derDecStep(derSEQDecStop(ptr, AlgId), ptr, count);
	 derDecStep(derBITDec2(0, ptr, count, 384), ptr, count);
	 ci->sig_offset = ptr - csr - 48;
	derDecStep(derSEQDecStop(ptr, CertReq), ptr, count);
	// возвратить точную длину DER-кода
	return ptr - csr;
}